

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O3

int repeat_segment_info(mixed_segment_info *info,mixed_segment *segment)

{
  info->name = "repeat";
  info->description = "Allows recording some input and then repeatedly playing it back.";
  info->flags = MIXED_IN;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  set_info_field(info->fields + 1,0x1e,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The time, in seconds, that is recorded and repeated.");
  set_info_field(info->fields + 2,2,8,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The samplerate at which the segment operates.");
  set_info_field(info->fields + 3,0x1f,MIXED_REPEAT_MODE_ENUM,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The current mode the repeater segment is in.");
  set_info_field(info->fields + 4,1,MIXED_BOOL,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Bypass the segment\'s processing.");
  clear_info_field(info->fields + 5);
  return 1;
}

Assistant:

int repeat_segment_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);

  info->name = "repeat";
  info->description = "Allows recording some input and then repeatedly playing it back.";
  info->flags = MIXED_INPLACE;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;

  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");

  set_info_field(field++, MIXED_REPEAT_TIME,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The time, in seconds, that is recorded and repeated.");

  set_info_field(field++, MIXED_SAMPLERATE,
                 MIXED_UINT32, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The samplerate at which the segment operates.");

  set_info_field(field++, MIXED_REPEAT_MODE,
                 MIXED_REPEAT_MODE_ENUM, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The current mode the repeater segment is in.");

  set_info_field(field++, MIXED_BYPASS,
                 MIXED_BOOL, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Bypass the segment's processing.");

  clear_info_field(field++);
  return 1;
}